

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_uint64
drmp3_read_src(drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,void *pUserData)

{
  drmp3_uint32 dVar1;
  long lVar2;
  long in_RCX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float sample;
  drmp3d_sample_t *frames;
  drmp3_uint64 totalFramesRead;
  float *pFramesOutF;
  drmp3 *pMP3;
  drmp3_uint64 local_38;
  float *local_30;
  long local_10;
  
  local_38 = 0;
  local_30 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    if (local_10 == 0) {
      return local_38;
    }
    for (; *(int *)(in_RCX + 0x1a4c) != 0 && local_10 != 0; local_10 = local_10 + -1) {
      lVar2 = in_RCX + 0x1a50;
      if (*(int *)(in_RCX + 0x1a40) == 1) {
        if (*(int *)(in_RCX + 0x1a20) == 1) {
          *local_30 = (float)(int)*(short *)(lVar2 + (ulong)*(uint *)(in_RCX + 0x1a48) * 2) /
                      32768.0;
        }
        else {
          *local_30 = (float)(int)*(short *)(lVar2 + (ulong)*(uint *)(in_RCX + 0x1a48) * 2) /
                      32768.0;
          local_30[1] = (float)(int)*(short *)(lVar2 + (ulong)*(uint *)(in_RCX + 0x1a48) * 2) /
                        32768.0;
        }
      }
      else if (*(int *)(in_RCX + 0x1a20) == 1) {
        *local_30 = ((float)(int)*(short *)(lVar2 + (ulong)(*(int *)(in_RCX + 0x1a48) *
                                                            *(int *)(in_RCX + 0x1a40) + 1) * 2) /
                     32768.0 +
                    (float)(int)*(short *)(lVar2 + (ulong)(uint)(*(int *)(in_RCX + 0x1a48) *
                                                                *(int *)(in_RCX + 0x1a40)) * 2) /
                    32768.0 + 0.0) * 0.5;
      }
      else {
        *local_30 = (float)(int)*(short *)(lVar2 + (ulong)(uint)(*(int *)(in_RCX + 0x1a48) *
                                                                *(int *)(in_RCX + 0x1a40)) * 2) /
                    32768.0;
        local_30[1] = (float)(int)*(short *)(lVar2 + (ulong)(*(int *)(in_RCX + 0x1a48) *
                                                             *(int *)(in_RCX + 0x1a40) + 1) * 2) /
                      32768.0;
      }
      *(int *)(in_RCX + 0x1a48) = *(int *)(in_RCX + 0x1a48) + 1;
      *(int *)(in_RCX + 0x1a4c) = *(int *)(in_RCX + 0x1a4c) + -1;
      local_38 = local_38 + 1;
      local_30 = local_30 + *(uint *)(in_RDI + 8);
    }
    if (local_10 == 0) break;
    dVar1 = drmp3_decode_next_frame((drmp3 *)0x10724d);
    if (dVar1 == 0) {
      return local_38;
    }
  }
  return local_38;
}

Assistant:

static drmp3_uint64 drmp3_read_src(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, void* pUserData)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->onRead != NULL);

    float* pFramesOutF = (float*)pFramesOut;
    drmp3_uint64 totalFramesRead = 0;

    while (frameCount > 0) {
        // Read from the in-memory buffer first.
        while (pMP3->pcmFramesRemainingInMP3Frame > 0 && frameCount > 0) {
            drmp3d_sample_t* frames = (drmp3d_sample_t*)pMP3->pcmFrames;
#ifndef DR_MP3_FLOAT_OUTPUT
            if (pMP3->mp3FrameChannels == 1) {
                if (pMP3->channels == 1) {
                    // Mono -> Mono.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                } else {
                    // Mono -> Stereo.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                    pFramesOutF[1] = frames[pMP3->pcmFramesConsumedInMP3Frame] / 32768.0f;
                }
            } else {
                if (pMP3->channels == 1) {
                    // Stereo -> Mono
                    float sample = 0;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0] / 32768.0f;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1] / 32768.0f;
                    pFramesOutF[0] = sample * 0.5f;
                } else {
                    // Stereo -> Stereo
                    pFramesOutF[0] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0] / 32768.0f;
                    pFramesOutF[1] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1] / 32768.0f;
                }
            }
#else
            if (pMP3->mp3FrameChannels == 1) {
                if (pMP3->channels == 1) {
                    // Mono -> Mono.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                } else {
                    // Mono -> Stereo.
                    pFramesOutF[0] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                    pFramesOutF[1] = frames[pMP3->pcmFramesConsumedInMP3Frame];
                }
            } else {
                if (pMP3->channels == 1) {
                    // Stereo -> Mono
                    float sample = 0;
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0];
                    sample += frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1];
                    pFramesOutF[0] = sample * 0.5f;
                } else {
                    // Stereo -> Stereo
                    pFramesOutF[0] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+0];
                    pFramesOutF[1] = frames[(pMP3->pcmFramesConsumedInMP3Frame*pMP3->mp3FrameChannels)+1];
                }
            }
#endif

            pMP3->pcmFramesConsumedInMP3Frame += 1;
            pMP3->pcmFramesRemainingInMP3Frame -= 1;
            totalFramesRead += 1;
            frameCount -= 1;
            pFramesOutF += pSRC->config.channels;
        }

        if (frameCount == 0) {
            break;
        }

                drmp3_assert(pMP3->pcmFramesRemainingInMP3Frame == 0);

        // At this point we have exhausted our in-memory buffer so we need to re-fill. Note that the sample rate may have changed
        // at this point which means we'll also need to update our sample rate conversion pipeline.
        if (drmp3_decode_next_frame(pMP3) == 0) {
            break;
        }
    }

    return totalFramesRead;
}